

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O1

spvc_bool spvc_compiler_msl_needs_buffer_size_buffer(spvc_compiler compiler)

{
  spvc_context this;
  bool bVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if (compiler->backend == SPVC_BACKEND_MSL) {
    bVar1 = *(size_type *)
             ((long)&(compiler->compiler)._M_t.
                     super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
                     .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl[3].
                     forced_temporaries._M_h + 8) != 0;
  }
  else {
    this = compiler->context;
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_38,"MSL function used on a non-MSL backend.","");
    std::__cxx11::string::operator=((string *)this,(string *)local_38);
    if (this->callback != (spvc_error_callback)0x0) {
      (*this->callback)(this->callback_userdata,(this->last_error)._M_dataplus._M_p);
    }
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

spvc_bool spvc_compiler_msl_needs_buffer_size_buffer(spvc_compiler compiler)
{
#if SPIRV_CROSS_C_API_MSL
	if (compiler->backend != SPVC_BACKEND_MSL)
	{
		compiler->context->report_error("MSL function used on a non-MSL backend.");
		return SPVC_FALSE;
	}

	auto &msl = *static_cast<CompilerMSL *>(compiler->compiler.get());
	return msl.needs_buffer_size_buffer() ? SPVC_TRUE : SPVC_FALSE;
#else
	compiler->context->report_error("MSL function used on a non-MSL backend.");
	return SPVC_FALSE;
#endif
}